

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cdata.c
# Opt level: O0

GCcdata * lj_cdata_newv(lua_State *L,CTypeID id,CTSize sz,CTSize align)

{
  GCSize osz;
  void *pvVar1;
  ulong uVar2;
  GCcdata *pGVar3;
  ulong uVar4;
  uint in_ECX;
  undefined4 in_EDX;
  undefined2 in_SI;
  long in_RDI;
  GCcdata *cd;
  uintptr_t almask;
  uintptr_t adata;
  char *p;
  MSize extra;
  global_State *g;
  GCSize in_stack_ffffffffffffffb0;
  void *in_stack_ffffffffffffffb8;
  lua_State *in_stack_ffffffffffffffc0;
  
  if (in_ECX < 4) {
    osz = 0;
  }
  else {
    osz = (1 << ((byte)in_ECX & 0x1f)) - 8;
  }
  pvVar1 = lj_mem_realloc(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,osz,
                          in_stack_ffffffffffffffb0);
  uVar2 = (ulong)((1 << ((byte)in_ECX & 0x1f)) - 1);
  uVar2 = (long)pvVar1 + uVar2 + 0x10 & (uVar2 ^ 0xffffffffffffffff);
  pGVar3 = (GCcdata *)(uVar2 - 8);
  *(short *)(uVar2 - 0x10) = (short)pGVar3 - (short)pvVar1;
  *(short *)(uVar2 - 0xe) = (short)osz + 0x10;
  *(undefined4 *)(uVar2 - 0xc) = in_EDX;
  uVar4 = (ulong)*(uint *)(in_RDI + 8);
  (pGVar3->nextgc).gcptr32 = *(uint32_t *)(uVar4 + 0x60);
  *(int *)(uVar4 + 0x60) = (int)pGVar3;
  *(byte *)(uVar2 - 4) = *(byte *)(uVar4 + 0x58) & 3;
  *(byte *)(uVar2 - 4) = *(byte *)(uVar2 - 4) | 0x80;
  *(undefined1 *)(uVar2 - 3) = 10;
  *(undefined2 *)(uVar2 - 2) = in_SI;
  *(long *)(uVar4 + 0xe0) = *(long *)(uVar4 + 0xe0) + 1;
  return pGVar3;
}

Assistant:

GCcdata *lj_cdata_newv(lua_State *L, CTypeID id, CTSize sz, CTSize align)
{
  global_State *g;
  MSize extra = sizeof(GCcdataVar) + sizeof(GCcdata) +
		(align > CT_MEMALIGN ? (1u<<align) - (1u<<CT_MEMALIGN) : 0);
  char *p = lj_mem_newt(L, extra + sz, char);
  uintptr_t adata = (uintptr_t)p + sizeof(GCcdataVar) + sizeof(GCcdata);
  uintptr_t almask = (1u << align) - 1u;
  GCcdata *cd = (GCcdata *)(((adata + almask) & ~almask) - sizeof(GCcdata));
  lj_assertL((char *)cd - p < 65536, "excessive cdata alignment");
  cdatav(cd)->offset = (uint16_t)((char *)cd - p);
  cdatav(cd)->extra = extra;
  cdatav(cd)->len = sz;
  g = G(L);
  setgcrefr(cd->nextgc, g->gc.root);
  setgcref(g->gc.root, obj2gco(cd));
  newwhite(g, obj2gco(cd));
  cd->marked |= 0x80;
  cd->gct = ~LJ_TCDATA;
  cd->ctypeid = id;
  g->gc.cdatanum++;
  return cd;
}